

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_getopt_inner(nn_sock *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  nn_fd nVar2;
  undefined8 in_RAX;
  nn_optset *pnVar3;
  size_t sVar4;
  undefined8 *__src;
  nn_efd *self_00;
  int intval;
  nn_fd fd;
  undefined8 local_28;
  
  if (level != 0) {
    if (0 < level) {
      iVar1 = (*self->sockbase->vfptr->getopt)(self->sockbase,level,option,optval,optvallen);
      return iVar1;
    }
    pnVar3 = nn_sock_optset(self,level);
    if (pnVar3 == (nn_optset *)0x0) {
      return -0x5c;
    }
    iVar1 = (*pnVar3->vfptr->getopt)(pnVar3,option,optval,optvallen);
    return iVar1;
  }
  iVar1 = -0x5c;
  switch(option) {
  case 1:
    iVar1 = self->linger;
    break;
  case 2:
    iVar1 = self->sndbuf;
    break;
  case 3:
    iVar1 = self->rcvbuf;
    break;
  case 4:
    iVar1 = self->sndtimeo;
    break;
  case 5:
    iVar1 = self->rcvtimeo;
    break;
  case 6:
    iVar1 = self->reconnect_ivl;
    break;
  case 7:
    iVar1 = self->reconnect_ivl_max;
    break;
  case 8:
    iVar1 = (self->ep_template).sndprio;
    break;
  case 9:
    iVar1 = (self->ep_template).rcvprio;
    break;
  case 10:
    if ((self->socktype->flags & 2) != 0) {
      return -0x5c;
    }
    self_00 = &self->sndfd;
    goto LAB_00120b66;
  case 0xb:
    if ((self->socktype->flags & 1) != 0) {
      return -0x5c;
    }
    self_00 = &self->rcvfd;
LAB_00120b66:
    local_28 = in_RAX;
    nVar2 = nn_efd_getfd(self_00);
    local_28 = CONCAT44(nVar2,(undefined4)local_28);
    sVar4 = 4;
    __src = (undefined8 *)((long)&local_28 + 4);
    if (*optvallen < 4) {
      sVar4 = *optvallen;
    }
    goto LAB_00120ba4;
  case 0xc:
    iVar1 = self->socktype->domain;
    break;
  case 0xd:
    iVar1 = self->socktype->protocol;
    break;
  case 0xe:
    iVar1 = (self->ep_template).ipv4only;
    break;
  case 0xf:
    strncpy((char *)optval,self->socket_name,*optvallen);
    sVar4 = strlen(self->socket_name);
    *optvallen = sVar4;
    goto LAB_00120bb3;
  case 0x10:
    iVar1 = self->rcvmaxsize;
    break;
  default:
    goto switchD_00120a6e_default;
  }
  local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),iVar1);
  sVar4 = 4;
  __src = &local_28;
  if (*optvallen < 4) {
    sVar4 = *optvallen;
    __src = &local_28;
  }
LAB_00120ba4:
  memcpy(optval,__src,sVar4);
  *optvallen = 4;
LAB_00120bb3:
  iVar1 = 0;
switchD_00120a6e_default:
  return iVar1;
}

Assistant:

int nn_sock_getopt_inner (struct nn_sock *self, int level,
    int option, void *optval, size_t *optvallen)
{
    int rc;
    struct nn_optset *optset;
    int intval;
    nn_fd fd;

    /*  Generic socket-level options. */
    if (level == NN_SOL_SOCKET) {
        switch (option) {
        case NN_DOMAIN:
            intval = self->socktype->domain;
            break;
        case NN_PROTOCOL:
            intval = self->socktype->protocol;
            break;
        case NN_LINGER:
            intval = self->linger;
            break;
        case NN_SNDBUF:
            intval = self->sndbuf;
            break;
        case NN_RCVBUF:
            intval = self->rcvbuf;
            break;
        case NN_RCVMAXSIZE:
            intval = self->rcvmaxsize;
            break;
        case NN_SNDTIMEO:
            intval = self->sndtimeo;
            break;
        case NN_RCVTIMEO:
            intval = self->rcvtimeo;
            break;
        case NN_RECONNECT_IVL:
            intval = self->reconnect_ivl;
            break;
        case NN_RECONNECT_IVL_MAX:
            intval = self->reconnect_ivl_max;
            break;
        case NN_SNDPRIO:
            intval = self->ep_template.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->ep_template.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->ep_template.ipv4only;
            break;
        case NN_SNDFD:
            if (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
                return -ENOPROTOOPT;
            fd = nn_efd_getfd (&self->sndfd);
            memcpy (optval, &fd,
                *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
            *optvallen = sizeof (nn_fd);
            return 0;
        case NN_RCVFD:
            if (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
                return -ENOPROTOOPT;
            fd = nn_efd_getfd (&self->rcvfd);
            memcpy (optval, &fd,
                *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
            *optvallen = sizeof (nn_fd);
            return 0;
        case NN_SOCKET_NAME:
            strncpy (optval, self->socket_name, *optvallen);
            *optvallen = strlen(self->socket_name);
            return 0;
        default:
            return -ENOPROTOOPT;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return 0;
    }

    /*  Protocol-specific socket options. */
    if (level > NN_SOL_SOCKET)
        return rc = self->sockbase->vfptr->getopt (self->sockbase,
            level, option, optval, optvallen);

    /*  Transport-specific options. */
    if (level < NN_SOL_SOCKET) {
        optset = nn_sock_optset (self, level);
        if (!optset)
            return -ENOPROTOOPT;
        return optset->vfptr->getopt (optset, option, optval, optvallen);
    }

    nn_assert (0);
}